

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O3

void fsnav_free_gnss(fsnav_gnss *gnss)

{
  double *__ptr;
  
  if (gnss != (fsnav_gnss *)0x0) {
    gnss->cfg_settings = (char *)0x0;
    gnss->settings_length = 0;
    gnss->cfg = (char *)0x0;
    gnss->cfglength = 0;
    fsnav_free_gnss_gps(gnss->gps);
    gnss->gps = (fsnav_gnss_gps *)0x0;
    fsnav_free_gnss_glo(gnss->glo);
    gnss->glo = (fsnav_gnss_glo *)0x0;
    fsnav_free_gnss_gal(gnss->gal);
    gnss->gal = (fsnav_gnss_gal *)0x0;
    fsnav_free_gnss_bds(gnss->bds);
    gnss->bds = (fsnav_gnss_bds *)0x0;
    __ptr = (gnss->sol).metrics;
    if (__ptr != (double *)0x0) {
      free(__ptr);
      (gnss->sol).metrics = (double *)0x0;
    }
  }
  return;
}

Assistant:

void fsnav_free_gnss(fsnav_gnss* gnss)
{
	if (gnss == NULL)
		return;

	// configuration
	gnss->cfg = NULL;
	gnss->cfglength = 0;
	gnss->cfg_settings = NULL;
	gnss->settings_length = 0;
	
	// gps data
	fsnav_free_gnss_gps(gnss->gps);
	gnss->gps = NULL;
	
	// glonass data
	fsnav_free_gnss_glo(gnss->glo);
	gnss->glo = NULL;
	
	// galileo data
	fsnav_free_gnss_gal(gnss->gal);
	gnss->gal = NULL;
	
	// beidou data
	fsnav_free_gnss_bds(gnss->bds);
	gnss->bds = NULL;

	fsnav_free_sol(&(gnss->sol));
}